

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O1

char * cmime_qp_rm_charenc(char *line_in)

{
  char cVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  sVar4 = strlen(line_in);
  pcVar5 = (char *)malloc(sVar4 + 1);
  uVar11 = 0;
  if (0 < (int)sVar4) {
    iVar12 = 0;
    do {
      iVar10 = (int)uVar11;
      if (line_in[iVar10] == '=') {
        if (line_in[(long)iVar10 + 1] != '?') {
          pcVar5[iVar12] = '=';
          goto LAB_0010b1e8;
        }
        pcVar7 = line_in + (long)(iVar10 + 1) + 1;
        iVar13 = iVar10 + 4;
        iVar3 = iVar10 + 6;
        do {
          iVar8 = iVar3;
          iVar10 = iVar13;
          iVar13 = iVar10 + 1;
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          iVar3 = iVar8 + 1;
        } while (cVar1 != '?');
        iVar10 = iVar10 + -1;
        pp_Var6 = __ctype_tolower_loc();
        if (((*pp_Var6)[line_in[iVar10]] == 0x62) || ((*pp_Var6)[line_in[iVar10]] == 0x71)) {
          lVar9 = 0;
          iVar10 = iVar8;
          do {
            pcVar5[lVar9 + iVar12] = line_in[lVar9 + iVar13];
            iVar10 = iVar10 + 1;
            lVar2 = lVar9 + (long)iVar13 + 1;
            lVar9 = lVar9 + 1;
          } while (line_in[lVar2] != '?');
          iVar12 = iVar12 + (int)lVar9;
        }
      }
      else {
        pcVar5[iVar12] = line_in[iVar10];
LAB_0010b1e8:
        iVar12 = iVar12 + 1;
      }
      uVar11 = (ulong)(iVar10 + 1U);
    } while ((int)(iVar10 + 1U) < (int)sVar4);
    uVar11 = (ulong)iVar12;
  }
  pcVar5[uVar11] = '\0';
  return pcVar5;
}

Assistant:

char *cmime_qp_rm_charenc(char *line_in) {
    char *line_out = NULL;
    int ipos = 0;
    int opos = 0;
    int line_in_len = strlen(line_in);

    line_out = malloc(strlen(line_in)+1*sizeof(char));
    for(ipos=0; ipos<line_in_len; ipos++) {
        if(line_in[ipos] == '=') {
            int orig_ipos = ipos;

            if(line_in[ipos+1] == '?') {
                ipos++;
                
                do {
                    ipos++;
                } while (line_in[ipos] != '?');

                ipos++;

                if(tolower(line_in[ipos]) == 'q' || tolower(line_in[ipos]) == 'b') {
                    ipos+=2;
                
                    do {
                        line_out[opos] = line_in[ipos];
                        opos++;
                        ipos++; 
                    } while (line_in[ipos] != '?');

                    ipos++;
                    continue;
                }
            } else {
                ipos = orig_ipos;
                line_out[opos] = line_in[ipos];
                opos++;
            }
        } else {    
            line_out[opos] = line_in[ipos];
            opos++;
        }
    }
    line_out[opos++] = '\0';
     return line_out;
}